

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::TSPI_PDU::SetMeasuredSpeed(TSPI_PDU *this,KFIXED16_3 *S)

{
  KUINT16 *pKVar1;
  DataTypeBase local_28;
  short local_20;
  KFIXED<short,_(unsigned_char)__x03_> local_18;
  
  if (((this->m_TSPIFlagUnion).m_ui8Flag & 0x20) == 0) {
    (this->m_TSPIFlagUnion).m_ui8Flag = (this->m_TSPIFlagUnion).m_ui8Flag | 0x20;
    pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + 2;
  }
  local_28._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00311e18;
  local_20 = S->m_Val;
  DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>::operator=(&local_18,&this->m_MeasureSpd);
  DATA_TYPE::DataTypeBase::~DataTypeBase(&local_18.super_DataTypeBase);
  DATA_TYPE::DataTypeBase::~DataTypeBase(&local_28);
  return;
}

Assistant:

void TSPI_PDU::SetMeasuredSpeed( KFIXED16_3 S )
{
    SetMeasuredSpeedFlag( true );
    m_MeasureSpd = S;
}